

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcrepl.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::FunctionReplacer::toReplacerPattern
          (FunctionReplacer *this,UnicodeString *rule,UBool escapeUnprintable)

{
  ushort uVar1;
  short sVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  UnicodeString *pUVar4;
  int32_t iVar5;
  UnicodeString str;
  UChar local_82;
  UChar *local_80;
  UChar *local_70;
  UnicodeString local_60;
  
  local_60.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_0048be70;
  local_60.fUnion.fStackFields.fLengthAndFlags = 2;
  uVar1 = (rule->fUnion).fStackFields.fLengthAndFlags;
  if ((uVar1 & 1) == 0) {
    if ((short)uVar1 < 0) {
      iVar3 = (rule->fUnion).fFields.fLength;
    }
    else {
      iVar3 = (int)(short)uVar1 >> 5;
    }
    if (iVar3 != 0) {
      (rule->fUnion).fStackFields.fLengthAndFlags = uVar1 & 0x1e;
    }
  }
  else {
    icu_63::UnicodeString::unBogus(rule);
  }
  local_82 = L'&';
  icu_63::UnicodeString::doAppend(rule,&local_82,0,1);
  iVar3 = (*(this->translit->super_UObject)._vptr_UObject[0xd])();
  pUVar4 = (UnicodeString *)CONCAT44(extraout_var,iVar3);
  sVar2 = (pUVar4->fUnion).fStackFields.fLengthAndFlags;
  if (sVar2 < 0) {
    iVar5 = (pUVar4->fUnion).fFields.fLength;
  }
  else {
    iVar5 = (int)sVar2 >> 5;
  }
  icu_63::UnicodeString::doAppend(rule,pUVar4,0,iVar5);
  icu_63::UnicodeString::doAppend(rule,L"( ",0,2);
  local_70 = L"( ";
  iVar3 = (*(this->replacer->super_UObject)._vptr_UObject[5])();
  pUVar4 = (UnicodeString *)
           (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x18))
                     ((long *)CONCAT44(extraout_var_00,iVar3),&local_60,(int)escapeUnprintable);
  sVar2 = (pUVar4->fUnion).fStackFields.fLengthAndFlags;
  if (sVar2 < 0) {
    iVar5 = (pUVar4->fUnion).fFields.fLength;
  }
  else {
    iVar5 = (int)sVar2 >> 5;
  }
  icu_63::UnicodeString::doAppend(rule,pUVar4,0,iVar5);
  icu_63::UnicodeString::doAppend(rule,L" )",0,2);
  local_80 = L" )";
  icu_63::UnicodeString::~UnicodeString(&local_60);
  return rule;
}

Assistant:

UnicodeString& FunctionReplacer::toReplacerPattern(UnicodeString& rule,
                                                   UBool escapeUnprintable) const {
    UnicodeString str;
    rule.truncate(0);
    rule.append(AMPERSAND);
    rule.append(translit->getID());
    rule.append(OPEN, 2);
    rule.append(replacer->toReplacer()->toReplacerPattern(str, escapeUnprintable));
    rule.append(CLOSE, 2);
    return rule;
}